

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall QMdiSubWindow::mouseReleaseEvent(QMdiSubWindow *this,QMouseEvent *mouseEvent)

{
  int iVar1;
  int iVar2;
  QMdiSubWindowPrivate *this_00;
  QWidgetData *pQVar3;
  QWidget *this_01;
  Representation RVar4;
  Representation RVar5;
  Representation RVar6;
  Operation OVar7;
  SubControl SVar8;
  int iVar9;
  QStyle *pQVar10;
  long in_FS_OFFSET;
  double dVar11;
  double dVar12;
  double dVar13;
  double in_XMM1_Qa;
  QStyleOptionTitleBar titleBarOptions;
  undefined8 local_b0;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QPalettePrivate *pQStack_80;
  undefined1 *local_78;
  QObject *pQStack_70;
  undefined1 *local_68;
  QArrayData *pQStack_60;
  char16_t *local_58;
  undefined1 *puStack_50;
  QIcon local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  if (*(long *)&(this_00->super_QWidgetPrivate).field_0x10 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QWidget::mouseReleaseEvent(&this->super_QWidget,mouseEvent);
      return;
    }
  }
  else {
    if (*(int *)(mouseEvent + 0x40) == 1) {
      if (this_00->currentOperation != None) {
        if ((this_00->isInRubberBandMode == true) && (this_00->isInInteractiveMode == false)) {
          QMdiSubWindowPrivate::leaveRubberBandMode(this_00);
        }
        if ((this_00->resizeEnabled != false) || (this_00->moveEnabled == true)) {
          pQVar3 = (this->super_QWidget).data;
          RVar4.m_i = (pQVar3->crect).y1.m_i;
          RVar5.m_i = (pQVar3->crect).x2.m_i;
          RVar6.m_i = (pQVar3->crect).y2.m_i;
          (this_00->oldGeometry).x1 = (Representation)(pQVar3->crect).x1.m_i;
          (this_00->oldGeometry).y1 = (Representation)RVar4.m_i;
          (this_00->oldGeometry).x2 = (Representation)RVar5.m_i;
          (this_00->oldGeometry).y2 = (Representation)RVar6.m_i;
        }
      }
      dVar11 = (double)QEventPoint::position();
      dVar11 = (double)((ulong)dVar11 & 0x8000000000000000 | 0x3fe0000000000000) + dVar11;
      dVar13 = 2147483647.0;
      if (dVar11 <= 2147483647.0) {
        dVar13 = dVar11;
      }
      if (dVar13 <= -2147483648.0) {
        dVar13 = -2147483648.0;
      }
      local_a8._0_4_ = (int)dVar13;
      in_XMM1_Qa = (double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   in_XMM1_Qa;
      dVar13 = 2147483647.0;
      if (in_XMM1_Qa <= 2147483647.0) {
        dVar13 = in_XMM1_Qa;
      }
      if (dVar13 <= -2147483648.0) {
        dVar13 = -2147483648.0;
      }
      local_a8._4_4_ = (int)dVar13;
      OVar7 = QMdiSubWindowPrivate::getOperation(this_00,(QPoint *)local_a8);
      this_00->currentOperation = OVar7;
      QMdiSubWindowPrivate::updateCursor(this_00);
      dVar12 = (double)QEventPoint::position();
      dVar12 = (double)((ulong)dVar12 & 0x8000000000000000 | 0x3fe0000000000000) + dVar12;
      dVar11 = 2147483647.0;
      if (dVar12 <= 2147483647.0) {
        dVar11 = dVar12;
      }
      if (dVar11 <= -2147483648.0) {
        dVar11 = -2147483648.0;
      }
      dVar13 = (double)((ulong)dVar13 & 0x8000000000000000 | 0x3fe0000000000000) + dVar13;
      dVar12 = 2147483647.0;
      if (dVar13 <= 2147483647.0) {
        dVar12 = dVar13;
      }
      if (dVar12 <= -2147483648.0) {
        dVar12 = -2147483648.0;
      }
      local_b0 = CONCAT44((int)dVar12,(int)dVar11);
      this_01 = *(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8;
      local_48.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_60 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_70 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_80 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QMdiSubWindowPrivate::titleBarOptions((QStyleOptionTitleBar *)local_a8,this_00);
      pQVar10 = QWidget::style(this_01);
      SVar8 = (**(code **)(*(long *)pQVar10 + 0xd0))
                        (pQVar10,5,(QStyleOptionTitleBar *)local_a8,&local_b0,this_01);
      QIcon::~QIcon(&local_48);
      if (pQStack_60 != (QArrayData *)0x0) {
        LOCK();
        (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQStack_60,2,0x10);
        }
      }
      QStyleOption::~QStyleOption((QStyleOption *)local_a8);
      this_00->hoveredSubControl = SVar8;
      if ((this_00->activeSubControl != SC_None) && (this_00->activeSubControl == SVar8)) {
        QMdiSubWindowPrivate::processClickedSubControl(this_00);
      }
      this_00->activeSubControl = SC_None;
      pQVar3 = (this->super_QWidget).data;
      iVar1 = (pQVar3->crect).x2.m_i;
      iVar2 = (pQVar3->crect).x1.m_i;
      iVar9 = QMdiSubWindowPrivate::titleBarHeight(this_00);
      QRegion::QRegion((QRegion *)local_a8,0,0,(iVar1 - iVar2) + 1,iVar9,Rectangle);
      QWidget::update(&this->super_QWidget,(QRegion *)local_a8);
      QRegion::~QRegion((QRegion *)local_a8);
    }
    else {
      mouseEvent[0xc] = (QMouseEvent)0x0;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::mouseReleaseEvent(QMouseEvent *mouseEvent)
{
    if (!parent()) {
        QWidget::mouseReleaseEvent(mouseEvent);
        return;
    }

    if (mouseEvent->button() != Qt::LeftButton) {
        mouseEvent->ignore();
        return;
    }

    Q_D(QMdiSubWindow);
    if (d->currentOperation != QMdiSubWindowPrivate::None) {
#if QT_CONFIG(rubberband)
        if (d->isInRubberBandMode && !d->isInInteractiveMode)
            d->leaveRubberBandMode();
#endif
        if (d->resizeEnabled || d->moveEnabled)
            d->oldGeometry = geometry();
    }

    d->currentOperation = d->getOperation(mouseEvent->position().toPoint());
    d->updateCursor();

    d->hoveredSubControl = d->getSubControl(mouseEvent->position().toPoint());
    if (d->activeSubControl != QStyle::SC_None
            && d->activeSubControl == d->hoveredSubControl) {
        d->processClickedSubControl();
    }
    d->activeSubControl = QStyle::SC_None;
    update(QRegion(0, 0, width(), d->titleBarHeight()));
}